

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR mergebackward(LispPTR base)

{
  LispPTR base_00;
  LispPTR *pLVar1;
  arrayblock *ptrailer;
  LispPTR pbase;
  LispPTR base_local;
  
  if (base == 0) {
    pbase = 0;
  }
  else {
    pLVar1 = NativeAligned4FromLAddr(base - 2);
    if ((((*ArrayMerging_word == 0) || (base == *ArraySpace_word)) || (base == *ArraySpace2_word))
       || ((*pLVar1 & 0x10000) == 0x10000)) {
      pbase = linkblock(base);
    }
    else {
      base_00 = base + (uint)(ushort)*pLVar1 * -2;
      checkarrayblock(base_00,1,0);
      deleteblock(base_00);
      pbase = arrayblockmerger(base_00,base);
    }
  }
  return pbase;
}

Assistant:

LispPTR mergebackward(LispPTR base) {
  LispPTR pbase;
  struct arrayblock *ptrailer;

  if (base == NIL)
    return (NIL);
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);
  if ((*ArrayMerging_word == NIL) ||
           ((base == *ArraySpace_word) || ((base == *ArraySpace2_word) || (ptrailer->inuse == T))))
    return (linkblock(base));
  pbase = base - 2 * ptrailer->arlen;
  checkarrayblock(pbase, T, NIL);
  deleteblock(pbase);
  return (arrayblockmerger(pbase, base));
}